

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scopy_to_ucol.c
# Opt level: O0

int ilu_scopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,float *dense,
                     int drop_rule,milu_t milu,double drop_tol,int quota,float *sum,int *nnzUj,
                     GlobalLU_t *Glu,float *work)

{
  int_t iVar1;
  int iVar2;
  float fVar3;
  int local_dc;
  int m0;
  double tol;
  int i_1;
  float zero;
  double tmp;
  float d_min;
  float d_max;
  int m;
  int_t nzumax;
  int_t *xusub;
  int_t *usub;
  float *ucol;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int_t mem_error;
  int_t nextu;
  int_t new_next;
  int jsupno;
  int irow;
  int isub;
  int fsupc;
  int k;
  int i;
  int segsze;
  int kfnz;
  int ksupno;
  int krep;
  int ksub;
  double drop_tol_local;
  float *dense_local;
  int *perm_r_local;
  int *repfnz_local;
  int *segrep_local;
  int local_10;
  int nseg_local;
  int jcol_local;
  
  tmp._4_4_ = 0.0;
  _krep = drop_tol;
  drop_tol_local = (double)dense;
  dense_local = (float *)perm_r;
  perm_r_local = repfnz;
  repfnz_local = segrep;
  segrep_local._4_4_ = nseg;
  local_10 = jcol;
  fVar3 = smach("Safe minimum");
  tmp._0_4_ = 1.0 / fVar3;
  tol._4_4_ = 0;
  tol._0_4_ = 1;
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  ucol = (float *)Glu->xlsub;
  usub = (int_t *)Glu->ucol;
  xusub = Glu->usub;
  _m = Glu->xusub;
  d_max = (float)Glu->nzumax;
  *sum = 0.0;
  if (drop_rule == 0) {
    _krep = -1.0;
    quota = Glu->n;
  }
  nextu = lsub[local_10];
  xsup._4_4_ = _m[local_10];
  isub = segrep_local._4_4_ + -1;
  ksupno = 0;
  do {
    if (segrep_local._4_4_ <= ksupno) {
      _m[local_10 + 1] = xsup._4_4_;
      d_min = (float)(_m[local_10 + 1] - _m[local_10]);
      if (((drop_rule & 0xeU) != 0) && (quota < (int)d_min)) {
        local_dc = _m[local_10] + (int)d_min + -1;
        if (0 < quota) {
          if ((drop_rule & 0x100U) == 0) {
            scopy_((integer *)&d_min,(real *)(usub + _m[local_10]),(integer *)&tol,work,
                   (integer *)&tol);
            tmp._4_4_ = sqselect((int)d_min,work,quota);
          }
          else {
            tmp._4_4_ = 1.0 / (1.0 / tmp._4_4_ +
                              ((1.0 / tmp._0_4_ - 1.0 / tmp._4_4_) * (float)quota) /
                              (float)(int)d_min);
          }
        }
        fsupc = _m[local_10];
        while (fsupc <= local_dc) {
          if (tmp._4_4_ < ABS((float)usub[fsupc])) {
            fsupc = fsupc + 1;
          }
          else {
            if (milu != SILU) {
              if (milu - SMILU_1 < 2) {
                *sum = (float)usub[fsupc] + *sum;
              }
              else if (milu == SMILU_3) {
                *sum = *sum + ABS((float)usub[fsupc]);
              }
            }
            usub[fsupc] = usub[local_dc];
            xusub[fsupc] = xusub[local_dc];
            local_dc = local_dc + -1;
            d_min = (float)((int)d_min + -1);
            _m[local_10 + 1] = _m[local_10 + 1] + -1;
          }
        }
      }
      if (milu == SMILU_2) {
        *sum = ABS(*sum);
      }
      *nnzUj = (int)d_min + *nnzUj;
      return 0;
    }
    iVar2 = isub + -1;
    kfnz = repfnz_local[isub];
    segsze = lsub[kfnz];
    isub = iVar2;
    if ((segsze != nextu) && (i = perm_r_local[kfnz], i != -1)) {
      irow = supno[segsze];
      jsupno = ((int)ucol[irow] + i) - irow;
      k = (kfnz - i) + 1;
      mem_error = xsup._4_4_ + k;
      while ((int)d_max < mem_error) {
        xsup._0_4_ = sLUMemXpand(local_10,xsup._4_4_,UCOL,(int_t *)&d_max,Glu);
        if ((int_t)xsup != 0) {
          return (int_t)xsup;
        }
        usub = (int_t *)Glu->ucol;
        iVar1 = sLUMemXpand(local_10,xsup._4_4_,USUB,(int_t *)&d_max,Glu);
        if (iVar1 != 0) {
          return iVar1;
        }
        xusub = Glu->usub;
        xlsub = Glu->lsub;
        xsup._0_4_ = 0;
      }
      for (fsupc = 0; fsupc < k; fsupc = fsupc + 1) {
        new_next = xlsub[jsupno];
        _i_1 = ABS((double)*(float *)((long)drop_tol_local + (long)new_next * 4));
        if ((quota < 1) || (_i_1 < _krep)) {
          if (milu != SILU) {
            if (milu - SMILU_1 < 2) {
              *sum = *(float *)((long)drop_tol_local + (long)new_next * 4) + *sum;
            }
            else if (milu == SMILU_3) {
              *sum = (float)((double)*sum + _i_1);
            }
          }
        }
        else {
          if ((double)tmp._4_4_ < _i_1) {
            tmp._4_4_ = (float)_i_1;
          }
          if (_i_1 < (double)tmp._0_4_) {
            tmp._0_4_ = (float)_i_1;
          }
          xusub[xsup._4_4_] = (int_t)dense_local[new_next];
          usub[xsup._4_4_] = *(int_t *)((long)drop_tol_local + (long)new_next * 4);
          xsup._4_4_ = xsup._4_4_ + 1;
        }
        *(undefined4 *)((long)drop_tol_local + (long)new_next * 4) = tol._4_4_;
        jsupno = jsupno + 1;
      }
    }
    ksupno = ksupno + 1;
  } while( true );
}

Assistant:

int
ilu_scopy_to_ucol(
	      int	 jcol,	   /* in */
	      int	 nseg,	   /* in */
	      int	 *segrep,  /* in */
	      int	 *repfnz,  /* in */
	      int	 *perm_r,  /* in */
	      float	 *dense,   /* modified - reset to zero on return */
	      int  	 drop_rule,/* in */
	      milu_t	 milu,	   /* in */
	      double	 drop_tol, /* in */
	      int	 quota,    /* maximum nonzero entries allowed */
	      float	 *sum,	   /* out - the sum of dropped entries */
	      int	 *nnzUj,   /* in - out */
	      GlobalLU_t *Glu,	   /* modified */
	      float	 *work	   /* working space with minimum size n,
				    * used by the second dropping rule */
	      )
{
/*
 * Gather from SPA dense[*] to global ucol[*].
 */
    int       ksub, krep, ksupno, kfnz, segsze;
    int       i, k; 
    int       fsupc, isub, irow;
    int       jsupno;
    int_t     new_next, nextu, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    float    *ucol;
    int_t     *usub, *xusub;
    int_t     nzumax;
    int       m; /* number of entries in the nonzero U-segments */
    register float d_max = 0.0, d_min = 1.0 / smach("Safe minimum");
    register double tmp;
    float zero = 0.0;
    int i_1 = 1;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (float *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;

    *sum = zero;
    if (drop_rule == NODROP) {
	drop_tol = -1.0, quota = Glu->n;
    }

    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

		fsupc = xsup[ksupno];
		isub = xlsub[fsupc] + kfnz - fsupc;
		segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    if ((mem_error = sLUMemXpand(jcol, nextu, UCOL, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    ucol = Glu->ucol;
		    if ((mem_error = sLUMemXpand(jcol, nextu, USUB, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}

		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub++];
		    tmp = fabs(dense[irow]);

		    /* first dropping rule */
		    if (quota > 0 && tmp >= drop_tol) {
			if (tmp > d_max) d_max = tmp;
			if (tmp < d_min) d_min = tmp;
			usub[nextu] = perm_r[irow];
			ucol[nextu] = dense[irow];
			nextu++;
		    } else {
			switch (milu) {
			    case SMILU_1:
			    case SMILU_2:
				*sum += dense[irow];
				break;
			    case SMILU_3:
				/* *sum += fabs(dense[irow]);*/
				*sum += tmp;
				break;
			    case SILU:
			    default:
				break;
			}
#ifdef DEBUG
			num_drop_U++;
#endif
		    }
		    dense[irow] = zero;
		}

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;	  /* Close U[*,jcol] */
    m = xusub[jcol + 1] - xusub[jcol];

    /* second dropping rule */
    if (drop_rule & DROP_SECONDARY && m > quota) {
	register double tol = d_max;
	register int m0 = xusub[jcol] + m - 1;

	if (quota > 0) {
	    if (drop_rule & DROP_INTERP) {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / m);
	    } else {
		scopy_(&m, &ucol[xusub[jcol]], &i_1, work, &i_1);
		tol = sqselect(m, work, quota);
#if 0
		A = &ucol[xusub[jcol]];
		for (i = 0; i < m; i++) work[i] = i;
		qsort(work, m, sizeof(int), _compare_);
		tol = fabs(usub[xusub[jcol] + work[quota]]);
#endif
	    }
	}
	for (i = xusub[jcol]; i <= m0; ) {
	    if (fabs(ucol[i]) <= tol) {
		switch (milu) {
		    case SMILU_1:
		    case SMILU_2:
			*sum += ucol[i];
			break;
		    case SMILU_3:
			*sum += fabs(ucol[i]);
			break;
		    case SILU:
		    default:
			break;
		}
		ucol[i] = ucol[m0];
		usub[i] = usub[m0];
		m0--;
		m--;
#ifdef DEBUG
		num_drop_U++;
#endif
		xusub[jcol + 1]--;
		continue;
	    }
	    i++;
	}
    }

    if (milu == SMILU_2) *sum = fabs(*sum);

    *nnzUj += m;

    return 0;
}